

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O3

void nn_cinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  int extraout_EDX_02;
  int iVar1;
  ulong uVar2;
  
  iVar1 = *(int *)&self[1].fn;
  if (iVar1 == 3) {
LAB_00128e72:
    if (src == 1) {
      if (type == 6) {
        *(undefined4 *)&self[1].fn = 2;
        nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,0xca,1);
        nn_sinproc_init((nn_sinproc *)&self[1].stopped,1,(nn_epbase *)&self[1].shutdown_fn,self);
        return;
      }
    }
    else {
LAB_00128f0e:
      nn_cinproc_handler_cold_1();
LAB_00128f17:
      nn_cinproc_handler_cold_6();
    }
    nn_cinproc_handler_cold_2();
LAB_00128f27:
    nn_cinproc_handler_cold_7();
    type = extraout_EDX_00;
LAB_00128f2e:
    iVar1 = type;
    nn_cinproc_handler_cold_5();
    type = extraout_EDX_01;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 != 1) {
        nn_cinproc_handler_cold_8();
        goto LAB_00128f0e;
      }
      if (src != -2) goto LAB_00128f17;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        iVar1 = 0xca;
        goto LAB_00128ef8;
      }
      goto LAB_00128f27;
    }
    if (src != 0x6c41) {
      if (src == -2) {
        if (type != 1) {
          nn_cinproc_handler_cold_4();
          type = extraout_EDX;
          goto LAB_00128e72;
        }
LAB_00128ed3:
        *(undefined4 *)&self[1].fn = 3;
        nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,0xca,-1);
        iVar1 = 0x65;
LAB_00128ef8:
        nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,iVar1,1);
        return;
      }
      goto LAB_00128f2e;
    }
    iVar1 = 0x6c41;
    if (type == 1) {
      nn_sinproc_accept((nn_sinproc *)&self[1].stopped,(nn_sinproc *)srcptr);
      goto LAB_00128ed3;
    }
  }
  uVar2 = (ulong)(uint)type;
  nn_cinproc_handler_cold_3();
  if (extraout_EDX_02 != -3 || iVar1 != -2) {
    if (*(int *)(uVar2 + 0x58) == 4) goto LAB_00128f65;
    nn_cinproc_shutdown_cold_1();
  }
  nn_cinproc_shutdown_cold_2();
LAB_00128f65:
  nn_cinproc_shutdown_cold_3();
  return;
}

Assistant:

static void nn_cinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);


    switch (cinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_CINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  DISCONNECTED state.                                                       */
/******************************************************************************/
    case NN_CINPROC_STATE_DISCONNECTED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_CINPROC_ACTION_CONNECT:
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        case NN_SINPROC_SRC_PEER:
            sinproc = (struct nn_sinproc*) srcptr;
            switch (type) {
            case NN_SINPROC_CONNECT:
                nn_sinproc_accept (&cinproc->sinproc, sinproc);
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_CINPROC_STATE_ACTIVE:
        switch (src) {
        case NN_CINPROC_SRC_SINPROC:
            switch (type) {
            case NN_SINPROC_DISCONNECT:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);

                nn_sinproc_init (&cinproc->sinproc, NN_CINPROC_SRC_SINPROC,
                    &cinproc->item.epbase, &cinproc->fsm);
                return;

            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cinproc->state, src, type);
    }
}